

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcSphere::IfcSphere(IfcSphere *this)

{
  *(undefined ***)&this->field_0x50 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x58 = 0;
  *(char **)&this->field_0x60 = "IfcSphere";
  IfcCsgPrimitive3D::IfcCsgPrimitive3D
            (&this->super_IfcCsgPrimitive3D,&PTR_construction_vtable_24__007e9da0);
  *(undefined8 *)&(this->super_IfcCsgPrimitive3D).field_0x40 = 0;
  (this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x7e9ce8;
  *(undefined8 *)&this->field_0x50 = 0x7e9d88;
  *(undefined8 *)
   &(this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7e9d10;
  *(undefined8 *)
   &(this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x7e9d38;
  *(undefined8 *)&(this->super_IfcCsgPrimitive3D).field_0x38 = 0x7e9d60;
  return;
}

Assistant:

IfcSphere() : Object("IfcSphere") {}